

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

int fmt::fprintf(FILE *__stream,char *__format,...)

{
  ArgList args;
  size_t __size;
  char *__ptr;
  size_t sVar1;
  char *in_RCX;
  anon_union_8_2_de49483c_for_ArgList_1 in_RDX;
  size_t size;
  MemoryWriter w;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  int iVar2;
  BasicWriter<char> *w_00;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  BasicWriter<char> local_249 [34];
  FILE *local_20;
  anon_union_8_2_de49483c_for_ArgList_1 local_18;
  BasicCStringRef<char> BStack_10;
  char *local_8;
  
  w_00 = local_249;
  local_20 = __stream;
  local_18 = in_RDX;
  BStack_10.data_ = in_RCX;
  local_8 = __format;
  std::allocator<char>::allocator();
  BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_fffffffffffffd80,(allocator<char> *)w_00);
  std::allocator<char>::~allocator((allocator<char> *)local_249);
  args.field_1.args_ = local_18.args_;
  args.types_ = (uint64_t)in_stack_fffffffffffffd80;
  printf<char>(w_00,BStack_10,args);
  __size = BasicWriter<char>::size((BasicWriter<char> *)0x5561a0);
  __ptr = BasicWriter<char>::data
                    ((BasicWriter<char> *)
                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  sVar1 = fwrite(__ptr,__size,1,local_20);
  if (sVar1 == 0) {
    iVar2 = -1;
  }
  else {
    iVar2 = (int)__size;
  }
  BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
            ((BasicMemoryWriter<char,_std::allocator<char>_> *)CONCAT44(iVar2,iVar2));
  return iVar2;
}

Assistant:

FMT_FUNC int fmt::fprintf(std::FILE *f, CStringRef format, ArgList args) {
  MemoryWriter w;
  printf(w, format, args);
  std::size_t size = w.size();
  return !std::fwrite(w.data(), size, 1, f) ? -1 : static_cast<int>(size);
}